

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void * __thiscall
ObjectBlockPool<512,_128>::GetBasePointer(ObjectBlockPool<512,_128> *this,void *ptr)

{
  LargeBlock<512,_128> **ppLVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = (this->sortedPages).count;
  if ((uVar6 != 0) && (ppLVar1 = (this->sortedPages).data, *ppLVar1 <= ptr)) {
    uVar6 = uVar6 - 1;
    uVar7 = (ulong)uVar6;
    pvVar4 = (void *)0x0;
    pvVar5 = pvVar4;
    if (ptr <= ppLVar1[uVar7] + 1) {
      if (1 < uVar6) {
        uVar6 = 0;
        do {
          uVar3 = uVar6 + (int)uVar7 >> 1;
          pvVar4 = (void *)(ulong)uVar3;
          uVar2 = uVar6;
          if (ppLVar1[(long)pvVar4] < ptr) {
            uVar2 = uVar3;
          }
          if (ptr < ppLVar1[(long)pvVar4]) {
            uVar7 = (ulong)uVar3;
            uVar2 = uVar6;
          }
          uVar6 = uVar2;
        } while (1 < (int)uVar7 - uVar6);
      }
      uVar6 = 0xffffffff;
      if (ppLVar1[(long)pvVar4] <= ptr) {
        uVar6 = (uint)(ppLVar1[(long)pvVar4] + 1 < ptr);
      }
      uVar7 = (long)ptr - (long)ppLVar1[uVar6 + (int)pvVar4]->page;
      pvVar5 = (void *)0x0;
      if (uVar7 < 0x10001) {
        pvVar5 = (void *)((long)ppLVar1[uVar6 + (int)pvVar4]->page +
                         (ulong)((uint)uVar7 & 0x1fe00) + 8);
      }
    }
    return pvVar5;
  }
  return (void *)0x0;
}

Assistant:

void* GetBasePointer(void* ptr)
	{
		if(sortedPages.count == 0 || ptr < sortedPages.data[0] || ptr > (char*)sortedPages.data[sortedPages.count - 1] + sizeof(MyLargeBlock))
			return NULL;

		// Binary search
		unsigned lowerBound = 0;
		unsigned upperBound = sortedPages.count - 1;
		unsigned pointer = 0;

		while(upperBound - lowerBound > 1)
		{
			pointer = (lowerBound + upperBound) >> 1;

			if(ptr < sortedPages.data[pointer])
				upperBound = pointer;
			else if(ptr > sortedPages.data[pointer])
				lowerBound = pointer;
		}

		if(ptr < sortedPages.data[pointer])
			pointer--;
		else if(ptr > (char*)sortedPages.data[pointer] + sizeof(MyLargeBlock))
			pointer++;

		MyLargeBlock *best = sortedPages.data[pointer];

		uintptr_t fromBase = (uintptr_t)((char*)ptr - (char*)best->page);

		if(fromBase > sizeof(best->page))
			return NULL;

		return (char*)best->page + (unsigned(fromBase) & ~(elemSize - 1)) + sizeof(markerType);
	}